

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::fboc::details::EmptyImageTest::EmptyImageTest
          (EmptyImageTest *this,Context *group,char *name,char *desc)

{
  allocator<char> local_5a;
  allocator<char> local_59;
  long *local_58 [2];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,name,&local_59);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,desc,&local_5a);
  tcu::TestCase::TestCase((TestCase *)this,group->m_testCtx,(char *)local_38[0],(char *)local_58[0])
  ;
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d2b098;
  (this->super_TestBase).m_ctx = group;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d2b1a0;
  return;
}

Assistant:

EmptyImageTest	(Context& group,
									 const char* name, const char* desc)
						: TestBase	(group, name, desc) {}